

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeparser.cpp
# Opt level: O2

void __thiscall QMakeParser::putOperator(QMakeParser *this,ushort **tokPtr)

{
  ushort *puVar1;
  ushort uVar2;
  
  if (this->m_operator == OrOperator) {
    uVar2 = 0x17;
  }
  else {
    if (this->m_operator != AndOperator) {
      return;
    }
    uVar2 = 0x16;
    if (this->m_state != StCond) goto LAB_00206824;
  }
  puVar1 = *tokPtr;
  *tokPtr = puVar1 + 1;
  *puVar1 = uVar2;
LAB_00206824:
  this->m_operator = NoOperator;
  return;
}

Assistant:

void QMakeParser::putOperator(ushort *&tokPtr)
{
    if (m_operator== AndOperator) {
        // A colon must be used after else and for() if no brace is used,
        // but in this case it is obviously not a binary operator.
        if (m_state == StCond)
            putTok(tokPtr, TokAnd);
        m_operator = NoOperator;
    } else if (m_operator == OrOperator) {
        putTok(tokPtr, TokOr);
        m_operator = NoOperator;
    }
}